

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void phosg::readx(int fd,void *data,size_t size)

{
  int fd_00;
  io_error *piVar1;
  string local_58;
  ssize_t local_28;
  ssize_t ret_size;
  size_t size_local;
  void *data_local;
  int fd_local;
  
  ret_size = size;
  size_local = (size_t)data;
  data_local._4_4_ = fd;
  local_28 = ::read(fd,data,size);
  if (local_28 < 0) {
    piVar1 = (io_error *)__cxa_allocate_exception(0x20);
    io_error::io_error(piVar1,data_local._4_4_);
    __cxa_throw(piVar1,&io_error::typeinfo,io_error::~io_error);
  }
  if (local_28 != ret_size) {
    piVar1 = (io_error *)__cxa_allocate_exception(0x20);
    fd_00 = data_local._4_4_;
    string_printf_abi_cxx11_(&local_58,"expected %zu bytes, read %zd bytes",ret_size,local_28);
    io_error::io_error(piVar1,fd_00,(string *)&local_58);
    __cxa_throw(piVar1,&io_error::typeinfo,io_error::~io_error);
  }
  return;
}

Assistant:

void readx(int fd, void* data, size_t size) {
  ssize_t ret_size = ::read(fd, data, size);
  if (ret_size < 0) {
    throw io_error(fd);
  } else if (ret_size != static_cast<ssize_t>(size)) {
    throw io_error(fd, string_printf("expected %zu bytes, read %zd bytes", size, ret_size));
  }
}